

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_script.cpp
# Opt level: O2

int CfdFreeMultisigScriptSigHandle(void *handle,void *multisig_handle)

{
  allocator local_39;
  string local_38;
  
  cfd::Initialize();
  std::__cxx11::string::string((string *)&local_38,"MultiScriptSig",&local_39);
  cfd::capi::FreeBuffer(multisig_handle,&local_38,0x15cc);
  std::__cxx11::string::~string((string *)&local_38);
  return 0;
}

Assistant:

int CfdFreeMultisigScriptSigHandle(void* handle, void* multisig_handle) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    FreeBuffer(
        multisig_handle, kPrefixMultisigScriptSig,
        sizeof(CfdCapiMultisigScriptSigData));
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}